

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cut.cpp
# Opt level: O2

longlong dinic_flow(int s,int t)

{
  undefined4 *puVar1;
  bool bVar2;
  int iVar3;
  undefined4 *puVar4;
  longlong flow;
  long lVar5;
  
  lVar5 = 0;
  puVar4 = (anonymous_namespace)::dis;
  puVar1 = DAT_0011f260;
  while( true ) {
    for (; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      *puVar4 = 0xffffffff;
    }
    bVar2 = bfs_dinic(s,t);
    puVar1 = DAT_0011f278;
    puVar4 = (anonymous_namespace)::ptr;
    if (!bVar2) break;
    for (; puVar4 != puVar1; puVar4 = puVar4 + 1) {
      *puVar4 = 0;
    }
    do {
      iVar3 = dfs_dinic(s,t,1000000000);
      lVar5 = lVar5 + iVar3;
      puVar4 = (anonymous_namespace)::dis;
      puVar1 = DAT_0011f260;
    } while (iVar3 != 0);
  }
  return lVar5;
}

Assistant:

long long dinic_flow(int s, int t) {
    long long flow = 0;
     
    while (true) {
        fill(dis.begin(), dis.end(), -1);
        
        if (!bfs_dinic(s, t)) {
            break;
        }
        
        fill(ptr.begin(), ptr.end(), 0);
        
        while (int pushed = dfs_dinic(s, t, INF)) {
            flow += pushed;
        }
    }
    return flow;
}